

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

CURLUcode parseurl_and_replace(char *url,CURLU *u,uint flags)

{
  char cVar1;
  byte bVar2;
  _Bool _Var3;
  CURLcode CVar4;
  CURLUcode CVar5;
  CURLUcode CVar6;
  int iVar7;
  size_t sVar8;
  size_t sVar9;
  char *pcVar10;
  Curl_handler *pCVar11;
  char *pcVar12;
  size_t sVar13;
  byte *pbVar14;
  char *pcVar15;
  uint uVar16;
  long lVar17;
  size_t buflen;
  size_t olen;
  Curl_URL *pCVar18;
  char **optionsp;
  size_t sVar19;
  ulong length;
  byte *pbVar20;
  bool bVar21;
  byte bVar22;
  dynbuf host;
  char *passwdp;
  CURLU tmpurl;
  char *userp;
  dynbuf enc;
  char schemebuf [41];
  dynbuf local_128;
  char *local_108;
  char *local_100;
  Curl_URL local_f8;
  char *local_98;
  char *local_90;
  dynbuf local_88;
  int local_68;
  char local_64;
  
  bVar22 = 0;
  local_f8.query = (char *)0x0;
  local_f8.fragment = (char *)0x0;
  local_f8.port = (char *)0x0;
  local_f8.path = (char *)0x0;
  local_f8.host = (char *)0x0;
  local_f8.zoneid = (char *)0x0;
  local_f8.password = (char *)0x0;
  local_f8.options = (char *)0x0;
  local_f8.scheme = (char *)0x0;
  local_f8.user = (char *)0x0;
  local_f8.portnum = 0;
  Curl_dyn_init(&local_128,8000000);
  sVar8 = strlen(url);
  CVar5 = CURLUE_MALFORMED_INPUT;
  if (8000000 < sVar8) goto LAB_00123c47;
  sVar9 = Curl_is_absolute_url(url,(char *)&local_68,buflen,(flags & 0x204) != 0);
  if (sVar9 == 0) {
    if ((flags & 0x204) == 0) {
      CVar5 = CURLUE_BAD_SCHEME;
    }
    else {
      pcVar10 = (char *)0x0;
      if ((flags & 4) != 0) {
        pcVar10 = "https";
      }
LAB_00123ebe:
      sVar19 = 0;
      while ((0x3f < (ulong)(byte)url[sVar19] ||
             ((0x8000800800000001U >> ((ulong)(byte)url[sVar19] & 0x3f) & 1) == 0))) {
        sVar19 = sVar19 + 1;
      }
      if (sVar19 == 0) {
        CVar5 = CURLUE_NO_HOST;
        if ((flags >> 10 & 1) != 0) goto LAB_00123f16;
      }
      else {
        CVar4 = Curl_dyn_addn(&local_128,url,sVar19);
        CVar5 = CURLUE_OUT_OF_MEMORY;
        if (CVar4 == CURLE_OK) {
LAB_00123f16:
          pbVar20 = (byte *)(url + sVar19);
          if ((int *)pcVar10 == (int *)0x0) {
            bVar21 = false;
          }
          else {
            local_f8.scheme = (*Curl_cstrdup)(pcVar10);
            bVar21 = true;
            if (local_f8.scheme == (char *)0x0) goto LAB_0012419c;
          }
LAB_00123f95:
          pcVar10 = strchr((char *)pbVar20,0x23);
          if (pcVar10 == (char *)0x0) {
            sVar8 = 0;
          }
          else {
            sVar8 = strlen(pcVar10);
            if (1 < sVar8) {
              local_f8.fragment = (char *)Curl_memdup(pcVar10 + 1,sVar8);
              if (local_f8.fragment == (char *)0x0) goto LAB_0012419c;
              _Var3 = junkscan(local_f8.fragment,flags);
              CVar5 = CURLUE_BAD_FRAGMENT;
              if (_Var3) goto LAB_00123c47;
            }
          }
          pcVar12 = strchr((char *)pbVar20,0x3f);
          if ((pcVar12 == (char *)0x0) || (pcVar10 != (char *)0x0 && pcVar10 <= pcVar12)) {
            sVar13 = strlen((char *)pbVar20);
            sVar19 = sVar13 - sVar8;
          }
          else {
            sVar13 = strlen(pcVar12);
            length = sVar13 - sVar8;
            sVar8 = strlen((char *)pbVar20);
            sVar19 = sVar8 - sVar13;
            if (length < 2) {
              local_f8.query = (*Curl_cstrdup)("");
              if (local_f8.query == (char *)0x0) goto LAB_0012419c;
            }
            else {
              if ((char)flags < '\0') {
                Curl_dyn_init(&local_88,8000000);
                CVar5 = urlencode_str(&local_88,pcVar12 + 1,length - 1,true,true);
                if (CVar5 != CURLUE_OK) goto LAB_001240eb;
                local_f8.query = Curl_dyn_ptr(&local_88);
              }
              else {
                local_f8.query = (char *)Curl_memdup(pcVar12 + 1,length);
                if (local_f8.query == (char *)0x0) {
LAB_001240eb:
                  CVar5 = CURLUE_OUT_OF_MEMORY;
                  goto LAB_00123c47;
                }
                local_f8.query[length - 1] = '\0';
              }
              _Var3 = junkscan(local_f8.query,flags);
              CVar5 = CURLUE_BAD_QUERY;
              if (_Var3) goto LAB_00123c47;
            }
          }
          if (sVar19 != 0) {
            if ((char)flags < '\0') {
              Curl_dyn_init(&local_88,8000000);
              CVar5 = urlencode_str(&local_88,(char *)pbVar20,sVar19,true,false);
              if (CVar5 != CURLUE_OK) goto LAB_0012419c;
              sVar19 = Curl_dyn_len(&local_88);
              pbVar20 = (byte *)Curl_dyn_ptr(&local_88);
              local_f8.path = (char *)pbVar20;
              if (sVar19 != 0) {
                if (pbVar20 == (byte *)0x0) {
                  pbVar20 = (byte *)0x0;
                  local_f8.path = (char *)0x0;
                  goto LAB_0012414c;
                }
                pbVar14 = pbVar20 + sVar19;
                goto LAB_001241e1;
              }
            }
            else {
              if ((byte *)local_f8.path == (byte *)0x0) {
LAB_0012414c:
                pbVar20 = (byte *)Curl_memdup(pbVar20,sVar19 + 1);
                local_f8.path = (char *)pbVar20;
                if (pbVar20 == (byte *)0x0) goto LAB_0012419c;
                pbVar14 = pbVar20 + sVar19;
LAB_001241e1:
                *pbVar14 = 0;
                local_f8.path = (char *)pbVar20;
              }
              _Var3 = junkscan(local_f8.path,flags);
              CVar5 = CURLUE_BAD_PATH;
              if (_Var3) goto LAB_00123c47;
              if ((flags & 0x10) == 0) {
                pbVar20 = (byte *)dedotdotify((char *)pbVar20,sVar19);
                if (pbVar20 == (byte *)0x0) goto LAB_0012419c;
                (*Curl_cfree)(local_f8.path);
                local_f8.path = (char *)pbVar20;
              }
            }
          }
          sVar19 = Curl_dyn_len(&local_128);
          if (sVar19 == 0) {
            if ((flags >> 10 & 1) != 0) {
              CVar4 = Curl_dyn_add(&local_128,"");
              CVar5 = CURLUE_OUT_OF_MEMORY;
              if (CVar4 != CURLE_OK) goto LAB_00123c47;
            }
LAB_001242eb:
            local_f8.host = Curl_dyn_ptr(&local_128);
            goto LAB_00123c60;
          }
          pcVar10 = (char *)0x0;
          local_90 = (char *)0x0;
          local_100 = (char *)0x0;
          local_108 = (char *)0x0;
          pcVar12 = Curl_dyn_ptr(&local_128);
          pcVar15 = strchr(pcVar12,0x40);
          CVar5 = CURLUE_OK;
          if (pcVar15 == (char *)0x0) {
LAB_00124335:
            (*Curl_cfree)(pcVar10);
            (*Curl_cfree)(local_100);
            (*Curl_cfree)(local_108);
            local_f8.user = (char *)0x0;
            local_f8.password = (char *)0x0;
            local_f8.options = (char *)0x0;
            if (pcVar15 != (char *)0x0) goto LAB_00123c47;
          }
          else {
            pcVar10 = pcVar15 + 1;
            local_98 = pcVar10;
            if (local_f8.scheme == (char *)0x0) {
              pcVar10 = pcVar10 + ~(ulong)pcVar12;
LAB_00124308:
              optionsp = (char **)0x0;
            }
            else {
              pCVar11 = Curl_builtin_scheme(local_f8.scheme,0xffffffffffffffff);
              pcVar10 = pcVar10 + ~(ulong)pcVar12;
              if (pCVar11 == (Curl_handler *)0x0) goto LAB_00124308;
              optionsp = &local_108;
              if ((pCVar11->flags & 0x400) == 0) {
                optionsp = (char **)0x0;
              }
            }
            CVar4 = Curl_parse_login_details(pcVar12,(size_t)pcVar10,&local_90,&local_100,optionsp);
            pcVar10 = local_90;
            CVar5 = CURLUE_BAD_LOGIN;
            if (CVar4 != CURLE_OK) goto LAB_00124335;
            if (local_90 != (char *)0x0) {
              if ((flags & 0x20) == 0) {
                _Var3 = junkscan(local_90,flags);
                if (!_Var3) {
                  local_f8.user = pcVar10;
                  goto LAB_00124450;
                }
                CVar5 = CURLUE_BAD_USER;
              }
              else {
                CVar5 = CURLUE_USER_NOT_ALLOWED;
              }
              goto LAB_00124335;
            }
LAB_00124450:
            pcVar12 = local_100;
            if (local_100 != (char *)0x0) {
              _Var3 = junkscan(local_100,flags);
              if (_Var3) {
                CVar5 = CURLUE_BAD_PASSWORD;
                goto LAB_00124335;
              }
              local_f8.password = pcVar12;
            }
            pcVar12 = local_108;
            if (local_108 != (char *)0x0) {
              _Var3 = junkscan(local_108,flags);
              if (_Var3) goto LAB_00124335;
              local_f8.options = pcVar12;
            }
            sVar8 = strlen(local_98);
            CVar4 = Curl_dyn_tail(&local_128,sVar8);
            CVar5 = CURLUE_OUT_OF_MEMORY;
            if (CVar4 != CURLE_OK) goto LAB_00123c47;
          }
          CVar5 = Curl_parse_port(&local_f8,&local_128,sVar9 != 0);
          if (CVar5 == CURLUE_OK) {
            pcVar10 = Curl_dyn_ptr(&local_128);
            _Var3 = junkscan(pcVar10,flags);
            CVar5 = CURLUE_BAD_HOSTNAME;
            if (!_Var3) {
              pcVar10 = Curl_dyn_ptr(&local_128);
              _Var3 = ipv4_normalize(pcVar10,(char *)&local_88,olen);
              if (_Var3) {
                Curl_dyn_reset(&local_128);
                CVar6 = Curl_dyn_add(&local_128,(char *)&local_88);
                CVar5 = CURLUE_OUT_OF_MEMORY;
              }
              else {
                CVar5 = decode_host(&local_128);
                if (CVar5 != CURLUE_OK) goto LAB_00123c47;
                pcVar10 = Curl_dyn_ptr(&local_128);
                sVar9 = Curl_dyn_len(&local_128);
                CVar5 = hostname_check(&local_f8,pcVar10,sVar9);
                CVar6 = CVar5;
              }
              if (CVar6 == CURLUE_OK) {
                if ((flags >> 9 & 1) != 0 && !bVar21) {
                  pcVar10 = Curl_dyn_ptr(&local_128);
                  iVar7 = curl_strnequal(pcVar10,"ftp.",4);
                  if (iVar7 == 0) {
                    iVar7 = curl_strnequal(pcVar10,"dict.",5);
                    if (iVar7 == 0) {
                      iVar7 = curl_strnequal(pcVar10,"ldap.",5);
                      if (iVar7 == 0) {
                        iVar7 = curl_strnequal(pcVar10,"imap.",5);
                        if (iVar7 == 0) {
                          iVar7 = curl_strnequal(pcVar10,"smtp.",5);
                          if (iVar7 == 0) {
                            iVar7 = curl_strnequal(pcVar10,"pop3.",5);
                            pcVar10 = "pop3";
                            if (iVar7 == 0) {
                              pcVar10 = "http";
                            }
                          }
                          else {
                            pcVar10 = "smtp";
                          }
                        }
                        else {
                          pcVar10 = "imap";
                        }
                      }
                      else {
                        pcVar10 = "ldap";
                      }
                    }
                    else {
                      pcVar10 = "dict";
                    }
                  }
                  else {
                    pcVar10 = "ftp";
                  }
                  local_f8.scheme = (*Curl_cstrdup)(pcVar10);
                  if (local_f8.scheme == (char *)0x0) goto LAB_0012419c;
                }
                goto LAB_001242eb;
              }
            }
          }
        }
      }
    }
  }
  else if (local_64 == '\0' && local_68 == 0x656c6966) {
    CVar5 = CURLUE_BAD_FILE_URL;
    if (6 < sVar8) {
      local_f8.scheme = (*Curl_cstrdup)("file");
      if (local_f8.scheme != (char *)0x0) {
        pbVar20 = (byte *)(url + 5);
        if ((*pbVar20 == 0x2f) && (url[6] == '/')) {
          pbVar20 = (byte *)(url + 7);
          if ((url[7] != 0x2f) &&
             (((0x19 < (byte)((url[7] & 0xdfU) + 0xbf) || ((url[8] != '|' && (url[8] != ':')))) ||
              ((cVar1 = url[9], cVar1 != '\0' && ((cVar1 != '/' && (cVar1 != '\\')))))))) {
            iVar7 = curl_strnequal((char *)pbVar20,"localhost/",10);
            if ((iVar7 == 0) &&
               (iVar7 = curl_strnequal((char *)pbVar20,"127.0.0.1/",10), iVar7 == 0))
            goto LAB_00123c47;
            pbVar20 = (byte *)(url + 0x10);
          }
        }
        Curl_dyn_reset(&local_128);
        if (*pbVar20 == 0x2f) {
          if (((byte)((pbVar20[1] & 0xdf) + 0xbf) < 0x1a) &&
             ((pbVar20[2] == 0x7c || (pbVar20[2] == 0x3a)))) {
            bVar2 = pbVar20[3];
LAB_00123f6d:
            if (((bVar2 == 0) || (bVar2 == 0x2f)) || (bVar21 = true, bVar2 == 0x5c))
            goto LAB_00123c47;
            goto LAB_00123f95;
          }
        }
        else if (((byte)((*pbVar20 & 0xdf) + 0xbf) < 0x1a) &&
                ((pbVar20[1] == 0x7c || (pbVar20[1] == 0x3a)))) {
          bVar2 = pbVar20[2];
          goto LAB_00123f6d;
        }
        bVar21 = true;
        goto LAB_00123f95;
      }
LAB_0012419c:
      CVar5 = CURLUE_OUT_OF_MEMORY;
    }
  }
  else {
    pcVar10 = url + sVar9 + 1;
    if (pcVar10 == (char *)0x0) {
      url = (char *)0x0;
      bVar21 = true;
    }
    else {
      uVar16 = ~(uint)sVar9 - (int)url;
      url = (char *)0x0;
      lVar17 = 0;
      do {
        if ((pcVar10[lVar17] != '/') || (3 < (uint)lVar17)) {
          url = pcVar10 + lVar17;
          uVar16 = (uint)lVar17;
          break;
        }
        lVar17 = lVar17 + 1;
      } while (pcVar10 + lVar17 != (char *)0x0);
      bVar21 = uVar16 - 4 < 0xfffffffd;
    }
    pcVar10 = (char *)&local_68;
    pCVar11 = Curl_builtin_scheme(pcVar10,0xffffffffffffffff);
    CVar5 = CURLUE_BAD_SLASHES;
    if ((flags & 8) == 0 && pCVar11 == (Curl_handler *)0x0) {
      CVar5 = CURLUE_UNSUPPORTED_SCHEME;
    }
    else if (!bVar21) {
      _Var3 = junkscan(pcVar10,flags);
      CVar5 = CURLUE_BAD_SCHEME;
      if (!_Var3) goto LAB_00123ebe;
    }
  }
LAB_00123c47:
  Curl_dyn_free(&local_128);
  free_urlhandle(&local_f8);
  if (CVar5 != CURLUE_OK) {
    return CVar5;
  }
LAB_00123c60:
  free_urlhandle(u);
  pCVar18 = &local_f8;
  for (lVar17 = 0xb; lVar17 != 0; lVar17 = lVar17 + -1) {
    u->scheme = pCVar18->scheme;
    pCVar18 = (Curl_URL *)((long)pCVar18 + ((ulong)bVar22 * -2 + 1) * 8);
    u = (CURLU *)((long)u + (ulong)bVar22 * -0x10 + 8);
  }
  return CURLUE_OK;
}

Assistant:

static CURLUcode parseurl_and_replace(const char *url, CURLU *u,
                                      unsigned int flags)
{
  CURLUcode result;
  CURLU tmpurl;
  memset(&tmpurl, 0, sizeof(tmpurl));
  result = parseurl(url, &tmpurl, flags);
  if(!result) {
    free_urlhandle(u);
    *u = tmpurl;
  }
  return result;
}